

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::EnforceCommentStyle::fixComment
          (EnforceCommentStyle *this,string *s,bool preserve_hash)

{
  char *pcVar1;
  char cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cVar2 = (this->super_FmtPass).opts.commentStyle;
  if (cVar2 == 'h') {
    if (*(s->_M_dataplus)._M_p != '/') {
      return;
    }
    std::__cxx11::string::substr((ulong)&local_60,(ulong)s);
    std::operator+(&local_40,"#",&local_60);
    std::__cxx11::string::operator=((string *)s,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    cVar2 = (this->super_FmtPass).opts.commentStyle;
  }
  if (((cVar2 == 's') && (pcVar1 = (s->_M_dataplus)._M_p, *pcVar1 == '#')) &&
     ((!preserve_hash || (pcVar1[1] != '!')))) {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)s);
    std::operator+(&local_40,"//",&local_60);
    std::__cxx11::string::operator=((string *)s,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void fixComment(std::string &s, bool preserve_hash)
    {
        if (opts.commentStyle == 'h' && s[0] == '/') {
            s = "#" + s.substr(2);
        }
        if (opts.commentStyle == 's' && s[0] == '#') {
            if (preserve_hash && s[1] == '!')
                return;
            s = "//" + s.substr(1);
        }
    }